

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1507.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  __suseconds_t extraout_RDX;
  __suseconds_t _Var8;
  __suseconds_t extraout_RDX_00;
  timeval tVar9;
  timeval tVar10;
  int still_running;
  int maxfd;
  undefined8 local_1d8;
  long curl_timeo;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  
  still_running = 1;
  curl_global_init(3);
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1507.c"
                  ,0x4b);
    iVar2 = 0x7c;
  }
  else {
    lVar4 = curl_multi_init();
    if (lVar4 != 0) {
      iVar2 = 0;
      uVar5 = curl_slist_append(0,"<1507-recipient@example.com>");
      curl_easy_setopt(lVar3,0x2712,URL);
      curl_easy_setopt(lVar3,0x2e,1);
      curl_easy_setopt(lVar3,0x4e2c,read_callback);
      curl_easy_setopt(lVar3,0x27ca,"<1507-realuser@example.com>");
      local_1d8 = uVar5;
      curl_easy_setopt(lVar3,0x27cb,uVar5);
      curl_easy_setopt(lVar3,0x29,1);
      iVar1 = curl_multi_add_handle(lVar4,lVar3);
      uVar5 = _stderr;
      if (iVar1 == 0) {
        tVar9 = tvnow();
        curl_multi_perform(lVar4,&still_running,tVar9.tv_usec);
        uVar5 = local_1d8;
        if (still_running != 0) {
          _Var8 = extraout_RDX;
          do {
            maxfd = -1;
            curl_timeo = -1;
            for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
              fdread.__fds_bits[lVar7] = 0;
            }
            for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
              fdwrite.__fds_bits[lVar7] = 0;
            }
            for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
              fdexcep.__fds_bits[lVar7] = 0;
            }
            timeout.tv_sec = 1;
            timeout.tv_usec = 0;
            curl_multi_timeout(lVar4,&curl_timeo,_Var8);
            if (-1 < curl_timeo) {
              timeout.tv_sec = (ulong)curl_timeo / 1000;
              if ((ulong)curl_timeo < 2000) {
                lVar7 = curl_timeo + -1000;
                if ((ulong)curl_timeo < 1000) {
                  lVar7 = curl_timeo;
                }
                timeout.tv_usec = lVar7 * 1000;
              }
              else {
                timeout.tv_sec = 1;
              }
            }
            curl_multi_fdset(lVar4,&fdread,&fdwrite,&fdexcep,&maxfd);
            iVar2 = select(maxfd + 1,(fd_set *)&fdread,(fd_set *)&fdwrite,(fd_set *)&fdexcep,
                           (timeval *)&timeout);
            tVar10 = tvnow();
            _Var8 = tVar10.tv_usec;
            if (0x3c < tVar10.tv_sec - tVar9.tv_sec) {
              iVar2 = 0;
              curl_mfprintf(_stderr,
                            "ABORTING TEST, since it seems that it would have run forever.\n");
              uVar5 = local_1d8;
              goto LAB_00102405;
            }
            if (iVar2 != -1) {
              curl_multi_perform(lVar4,&still_running);
              _Var8 = extraout_RDX_00;
            }
          } while (still_running != 0);
          iVar2 = 0;
          uVar5 = local_1d8;
        }
      }
      else {
        uVar6 = curl_multi_strerror(iVar1);
        curl_mfprintf(uVar5,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1507.c"
                      ,0x5e,iVar1,uVar6);
        uVar5 = local_1d8;
        iVar2 = iVar1;
      }
      goto LAB_00102405;
    }
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1507.c"
                  ,0x4d);
    iVar2 = 0x7b;
  }
  lVar4 = 0;
  uVar5 = 0;
LAB_00102405:
  curl_slist_free_all(uVar5);
  curl_multi_remove_handle(lVar4,lVar3);
  curl_multi_cleanup(lVar4);
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
  return iVar2;
}

Assistant:

int test(char *URL)
{
   int res = 0;
   CURL *curl = NULL;
   CURLM *mcurl = NULL;
   int still_running = 1;
   struct timeval mp_start;
   struct curl_slist *rcpt_list = NULL;

   curl_global_init(CURL_GLOBAL_DEFAULT);

   easy_init(curl);

   multi_init(mcurl);

   rcpt_list = curl_slist_append(rcpt_list, RECIPIENT);
   /* more addresses can be added here
      rcpt_list = curl_slist_append(rcpt_list, "<others@example.com>");
   */

   curl_easy_setopt(curl, CURLOPT_URL, URL);
#if 0
   curl_easy_setopt(curl, CURLOPT_USERNAME, USERNAME);
   curl_easy_setopt(curl, CURLOPT_PASSWORD, PASSWORD);
#endif
   curl_easy_setopt(curl, CURLOPT_UPLOAD, 1L);
   curl_easy_setopt(curl, CURLOPT_READFUNCTION, read_callback);
   curl_easy_setopt(curl, CURLOPT_MAIL_FROM, MAILFROM);
   curl_easy_setopt(curl, CURLOPT_MAIL_RCPT, rcpt_list);
   curl_easy_setopt(curl, CURLOPT_VERBOSE, 1L);
   multi_add_handle(mcurl, curl);

   mp_start = tvnow();

  /* we start some action by calling perform right away */
  curl_multi_perform(mcurl, &still_running);

  while(still_running) {
    struct timeval timeout;
    int rc; /* select() return code */

    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -1;

    long curl_timeo = -1;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    /* set a suitable timeout to play around with */
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    curl_multi_timeout(mcurl, &curl_timeo);
    if(curl_timeo >= 0) {
      timeout.tv_sec = curl_timeo / 1000;
      if(timeout.tv_sec > 1)
        timeout.tv_sec = 1;
      else
        timeout.tv_usec = (curl_timeo % 1000) * 1000;
    }

    /* get file descriptors from the transfers */
    curl_multi_fdset(mcurl, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* In a real-world program you OF COURSE check the return code of the
       function calls.  On success, the value of maxfd is guaranteed to be
       greater or equal than -1.  We call select(maxfd + 1, ...), specially in
       case of (maxfd == -1), we call select(0, ...), which is basically equal
       to sleep. */

    rc = select(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    if(tvdiff(tvnow(), mp_start) > MULTI_PERFORM_HANG_TIMEOUT) {
      fprintf(stderr, "ABORTING TEST, since it seems "
              "that it would have run forever.\n");
      break;
    }

    switch(rc) {
    case -1:
      /* select error */
      break;
    case 0: /* timeout */
    default: /* action */
      curl_multi_perform(mcurl, &still_running);
      break;
    }
  }

test_cleanup:

  curl_slist_free_all(rcpt_list);
  curl_multi_remove_handle(mcurl, curl);
  curl_multi_cleanup(mcurl);
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}